

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::WildcardPattern::WildcardPattern
          (WildcardPattern *this,string *pattern,Choice caseSensitivity)

{
  bool bVar1;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  char in_stack_ffffffffffffff7f;
  string *in_stack_ffffffffffffff80;
  undefined8 *puVar2;
  string local_68 [24];
  string *in_stack_ffffffffffffffb0;
  WildcardPattern *in_stack_ffffffffffffffb8;
  string local_38 [56];
  
  *in_RDI = &PTR__WildcardPattern_0048e510;
  *(undefined4 *)(in_RDI + 1) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  normaliseString(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  bVar1 = startsWith(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)(in_RDI + 2));
    std::__cxx11::string::operator=((string *)(in_RDI + 2),local_38);
    std::__cxx11::string::~string(local_38);
    *(undefined4 *)((long)in_RDI + 0xc) = 1;
  }
  bVar1 = endsWith(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
  if (bVar1) {
    puVar2 = in_RDI + 2;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_68,(ulong)puVar2);
    std::__cxx11::string::operator=((string *)(in_RDI + 2),local_68);
    std::__cxx11::string::~string(local_68);
    *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) | 2;
  }
  return;
}

Assistant:

WildcardPattern::WildcardPattern( std::string const& pattern,
                                      CaseSensitive::Choice caseSensitivity )
    :   m_caseSensitivity( caseSensitivity ),
        m_pattern( normaliseString( pattern ) )
    {
        if( startsWith( m_pattern, '*' ) ) {
            m_pattern = m_pattern.substr( 1 );
            m_wildcard = WildcardAtStart;
        }
        if( endsWith( m_pattern, '*' ) ) {
            m_pattern = m_pattern.substr( 0, m_pattern.size()-1 );
            m_wildcard = static_cast<WildcardPosition>( m_wildcard | WildcardAtEnd );
        }
    }